

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

PatternList *
parse_short(PatternList *__return_storage_ptr__,Tokens *tokens,
           vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  Variant *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pOVar3;
  pointer __n;
  int iVar4;
  string *psVar5;
  size_type *extraout_RAX;
  size_type *psVar6;
  long *plVar7;
  runtime_error *prVar8;
  long *plVar9;
  Option *option;
  pointer pOVar10;
  undefined1 *puVar11;
  undefined1 auVar12 [8];
  _Alloc_hider _Var13;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  byte *pbVar14;
  string local_168;
  string local_148;
  char *local_128;
  size_type local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  shared_ptr<docopt::Option> o;
  undefined1 local_e8 [8];
  string token;
  string shortOpt;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  pointer local_80;
  value val;
  string error;
  
  Tokens::pop_abi_cxx11_((string *)local_e8,tokens);
  pVVar1 = &val.variant;
  local_80 = (pointer)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-","");
  pOVar10 = local_80;
  if ((token._M_dataplus._M_p < (ulong)val._0_8_) ||
     ((val._0_8_ != 0 && (iVar4 = bcmp(local_80,(void *)local_e8,val._0_8_), iVar4 != 0)))) {
    __assert_fail("starts_with(token, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x120,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  if (pOVar10 != (pointer)pVVar1) {
    operator_delete(pOVar10);
  }
  local_80 = (pointer)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"--","");
  pOVar10 = local_80;
  _Var13 = token._M_dataplus;
  auVar12 = local_e8;
  if (((ulong)val._0_8_ <= token._M_dataplus._M_p) &&
     ((val._0_8_ == 0 || (iVar4 = bcmp(local_80,(void *)local_e8,val._0_8_), iVar4 == 0)))) {
    __assert_fail("!starts_with(token, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x121,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  if (pOVar10 != (pointer)pVVar1) {
    operator_delete(pOVar10);
    auVar12 = local_e8;
    _Var13 = token._M_dataplus;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (_Var13._M_p != (pointer)0x1) {
    pbVar14 = (byte *)((long)auVar12 + 1);
    do {
      token.field_2._8_8_ = &shortOpt._M_string_length;
      shortOpt._M_string_length._0_2_ = (ushort)*pbVar14 << 8 | 0x2d;
      shortOpt._M_dataplus._M_p = (pointer)0x2;
      shortOpt._M_string_length._2_1_ = 0;
      pbVar14 = pbVar14 + 1;
      shortOpt.field_2._8_8_ = 0;
      similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pOVar10 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar10 == pOVar3) {
LAB_00166353:
        local_80 = (pointer)((ulong)local_80 & 0xffffffff00000000);
        std::vector<docopt::Option,std::allocator<docopt::Option>>::
        emplace_back<std::__cxx11::string&,char_const(&)[1],int>
                  ((vector<docopt::Option,std::allocator<docopt::Option>> *)options,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&token.field_2 + 8),(char (*) [1])0x182021,(int *)&local_80);
        val.variant._24_8_ = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&error,
                   (Option **)((long)&val.variant + 0x18),(allocator<docopt::Option> *)&local_80,
                   (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -1);
        if (tokens->fIsParsingArgv == true) {
          local_80 = (pointer)CONCAT44(local_80._4_4_,1);
          val.kind._0_1_ = 1;
          docopt::LeafPattern::setValue((LeafPattern *)val.variant._24_8_,(value *)&local_80);
          if ((int)local_80 == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&val);
          }
          else if (((int)local_80 == 3) &&
                  ((undefined1 *)val._0_8_ != (undefined1 *)((long)&val.variant + 8))) {
            operator_delete((void *)val._0_8_);
          }
        }
        local_80 = (pointer)val.variant._24_8_;
        val._0_8_ = error._M_dataplus._M_p;
        if (error._M_dataplus._M_p != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(error._M_dataplus._M_p + 8) = *(int *)(error._M_dataplus._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(error._M_dataplus._M_p + 8) = *(int *)(error._M_dataplus._M_p + 8) + 1;
          }
        }
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Pattern>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)&local_80);
        _Var13 = error._M_dataplus;
        if (val._0_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)val._0_8_);
          _Var13 = error._M_dataplus;
        }
      }
      else {
        do {
          __n = (pointer)(pOVar10->fShortOption)._M_string_length;
          if ((__n == shortOpt._M_dataplus._M_p) &&
             ((__n == (pointer)0x0 ||
              (iVar4 = bcmp((pOVar10->fShortOption)._M_dataplus._M_p,(void *)token.field_2._8_8_,
                            (size_t)__n), iVar4 == 0)))) {
            local_80 = pOVar10;
            if (similar.
                super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
                _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>::
              _M_realloc_insert<docopt::Option_const*>
                        ((vector<docopt::Option_const*,std::allocator<docopt::Option_const*>> *)
                         (shortOpt.field_2._M_local_buf + 8),(iterator)0x0,(Option **)&local_80);
            }
            else {
              *similar.
               super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
               _M_impl.super__Vector_impl_data._M_start = pOVar10;
              similar.
              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   similar.
                   super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          pOVar10 = pOVar10 + 1;
        } while (pOVar10 != pOVar3);
        if (8 < (ulong)((long)similar.
                              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                              ._M_impl.super__Vector_impl_data._M_start - shortOpt.field_2._8_8_)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&token.field_2 + 8)," is specified ambiguously ");
          std::__cxx11::to_string
                    (&local_168,
                     (long)similar.
                           super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                           ._M_impl.super__Vector_impl_data._M_start - shortOpt.field_2._8_8_ >> 3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&val.variant + 0x18),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_168);
          plVar7 = (long *)std::__cxx11::string::append((char *)((long)&val.variant + 0x18));
          local_80 = (pointer)*plVar7;
          plVar9 = plVar7 + 2;
          if (local_80 == (pointer)plVar9) {
            val.variant.longValue = *plVar9;
            val.variant.strValue._M_string_length = plVar7[3];
            local_80 = (pointer)&val.variant;
          }
          else {
            val.variant.longValue = *plVar9;
          }
          val._0_8_ = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (val.variant._24_8_ != &error._M_string_length) {
            operator_delete((void *)val.variant._24_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if (local_108 !=
              (undefined1  [8])
              &o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)local_108);
          }
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,(string *)&local_80);
          *(undefined ***)prVar8 = &PTR__runtime_error_00199ab0;
          __cxa_throw(prVar8,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((pointer)shortOpt.field_2._8_8_ ==
            similar.
            super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start) goto LAB_00166353;
        local_108 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&o,(Option **)local_108,
                   (allocator<docopt::Option> *)&local_80,*(Option **)shortOpt.field_2._8_8_);
        local_80 = (pointer)((ulong)local_80 & 0xffffffff00000000);
        puVar11 = (undefined1 *)((long)&val.variant + 8);
        if (*(int *)((long)local_108 + 0x90) != 0) {
          if (pbVar14 == (byte *)((long)local_e8 + (long)token._M_dataplus._M_p)) {
            psVar5 = Tokens::current_abi_cxx11_(tokens);
            if ((psVar5->_M_string_length == 0) ||
               (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&val.variant + 0x18),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&token.field_2 + 8)," requires an argument");
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,(string *)((long)&val.variant + 0x18));
              *(undefined ***)prVar8 = &PTR__runtime_error_00199ab0;
              __cxa_throw(prVar8,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
            }
            Tokens::pop_abi_cxx11_(&local_148,tokens);
            val.variant._24_4_ = 3;
            error._M_dataplus._M_p = (pointer)&error.field_2;
            paVar2 = &local_148.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p == paVar2) {
              error.field_2._8_8_ = local_148.field_2._8_8_;
            }
            else {
              error._M_dataplus._M_p = local_148._M_dataplus._M_p;
            }
            error.field_2._M_allocated_capacity._1_7_ =
                 local_148.field_2._M_allocated_capacity._1_7_;
            error.field_2._M_local_buf[0] = local_148.field_2._M_local_buf[0];
            error._M_string_length = local_148._M_string_length;
            local_148._M_string_length = 0;
            local_148.field_2._M_local_buf[0] = '\0';
            local_148._M_dataplus._M_p = (pointer)paVar2;
            if ((int)local_80 == 4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&val);
            }
            else if (((int)local_80 == 3) && ((undefined1 *)val._0_8_ != puVar11)) {
              operator_delete((void *)val._0_8_);
            }
            local_80 = (pointer)CONCAT44(local_80._4_4_,val.variant._24_4_);
            switch(val.variant._24_4_) {
            case 1:
              val.kind._0_1_ = error._M_dataplus._M_p._0_1_;
              break;
            case 2:
              val._0_8_ = error._M_dataplus._M_p;
              break;
            case 3:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error._M_dataplus._M_p == &error.field_2) {
                val.variant.strList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error.field_2._8_8_;
                val._0_8_ = puVar11;
              }
              else {
                val._0_8_ = error._M_dataplus._M_p;
              }
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              val.variant.longValue = error._M_string_length;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity =
                   error.field_2._M_allocated_capacity & 0xffffffffffffff00;
              error._M_dataplus._M_p = (pointer)&error.field_2;
              break;
            case 4:
              val._0_8_ = error._M_dataplus._M_p;
              val.variant.longValue = error._M_string_length;
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              error._M_dataplus._M_p = (pointer)0x0;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity = 0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
          }
          else {
            local_128 = &local_118;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((string *)&local_128,pbVar14);
            val.variant._24_4_ = 3;
            paVar2 = &error.field_2;
            if (local_128 == &local_118) {
              error.field_2._8_8_ = uStack_110;
              error._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              error._M_dataplus._M_p = local_128;
            }
            error.field_2._M_allocated_capacity._1_7_ = uStack_117;
            error.field_2._M_local_buf[0] = local_118;
            error._M_string_length = local_120;
            local_120 = 0;
            local_118 = '\0';
            if ((int)local_80 == 4) {
              local_128 = &local_118;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&val);
            }
            else {
              local_128 = &local_118;
              if (((int)local_80 == 3) &&
                 ((undefined1 *)val._0_8_ != (undefined1 *)((long)&val.variant + 8))) {
                operator_delete((void *)val._0_8_);
              }
            }
            local_80 = (pointer)CONCAT44(local_80._4_4_,val.variant._24_4_);
            switch(val.variant._24_4_) {
            case 1:
              val.kind._0_1_ = error._M_dataplus._M_p._0_1_;
              break;
            case 2:
              val._0_8_ = error._M_dataplus._M_p;
              break;
            case 3:
              val._0_8_ = (long)&val.variant + 8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error._M_dataplus._M_p == paVar2) {
                val.variant.strList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error.field_2._8_8_;
              }
              else {
                val._0_8_ = error._M_dataplus._M_p;
              }
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              val.variant.longValue = error._M_string_length;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity =
                   error.field_2._M_allocated_capacity & 0xffffffffffffff00;
              error._M_dataplus._M_p = (pointer)paVar2;
              break;
            case 4:
              val._0_8_ = error._M_dataplus._M_p;
              val.variant.longValue = error._M_string_length;
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              error._M_dataplus._M_p = (pointer)0x0;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity = 0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error);
            }
            if (local_128 != &local_118) {
              operator_delete(local_128);
            }
            pbVar14 = (byte *)((long)local_e8 + (long)token._M_dataplus._M_p);
          }
        }
        puVar11 = (undefined1 *)((long)&val.variant + 8);
        if (tokens->fIsParsingArgv == true) {
          if ((int)local_80 == 0) {
            val.variant._24_4_ = 1;
            error._M_dataplus._M_p._0_1_ = 1;
          }
          else {
            val.variant._24_4_ = (int)local_80;
            switch((int)local_80) {
            case 1:
              error._M_dataplus._M_p._0_1_ = (undefined1)val.kind;
              break;
            case 2:
              error._M_dataplus._M_p = (pointer)val._0_8_;
              break;
            case 3:
              error._M_dataplus._M_p = (pointer)&error.field_2;
              if ((undefined1 *)val._0_8_ == puVar11) {
                error.field_2._8_8_ =
                     val.variant.strList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              else {
                error._M_dataplus._M_p = (pointer)val._0_8_;
              }
              error.field_2._M_allocated_capacity = val.variant.strValue._M_string_length;
              error._M_string_length = val.variant.longValue;
              val.variant.longValue = 0;
              val.variant.strValue._M_string_length =
                   val.variant.strValue._M_string_length & 0xffffffffffffff00;
              val._0_8_ = puVar11;
              break;
            case 4:
              error._M_dataplus._M_p = (pointer)val._0_8_;
              error._M_string_length = val.variant.longValue;
              error.field_2._M_allocated_capacity = val.variant.strValue._M_string_length;
              val.kind = Empty;
              val._4_4_ = 0;
              val.variant.longValue = 0;
              val.variant.strValue._M_string_length = 0;
            }
          }
          docopt::LeafPattern::setValue
                    ((LeafPattern *)local_108,(value *)((long)&val.variant + 0x18));
          if (val.variant._24_4_ == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error);
          }
          else if ((val.variant._24_4_ == 3) &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)error._M_dataplus._M_p != &error.field_2)) {
            operator_delete(error._M_dataplus._M_p);
          }
        }
        val.variant._24_8_ = local_108;
        error._M_dataplus._M_p =
             (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar5 = &((o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_LeafPattern).fName;
            *(int *)&(psVar5->_M_dataplus)._M_p = *(int *)&(psVar5->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            psVar5 = &((o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_LeafPattern).fName;
            *(int *)&(psVar5->_M_dataplus)._M_p = *(int *)&(psVar5->_M_dataplus)._M_p + 1;
          }
        }
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Pattern>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,
                   (shared_ptr<docopt::Pattern> *)((long)&val.variant.strValue.field_2 + 8));
        if (error._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error._M_dataplus._M_p);
        }
        if ((int)local_80 == 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&val);
          _Var13._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
        }
        else {
          _Var13._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
          if (((int)local_80 == 3) && ((undefined1 *)val._0_8_ != puVar11)) {
            operator_delete((void *)val._0_8_);
            _Var13._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr;
          }
        }
      }
      if ((element_type *)_Var13._M_p != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var13._M_p);
      }
      if (shortOpt.field_2._8_8_ != 0) {
        operator_delete((void *)shortOpt.field_2._8_8_);
      }
      if ((size_type *)token.field_2._8_8_ != &shortOpt._M_string_length) {
        operator_delete((void *)token.field_2._8_8_);
      }
      auVar12 = local_e8;
    } while (pbVar14 != (byte *)(token._M_dataplus._M_p + (long)local_e8));
  }
  psVar6 = &token._M_string_length;
  if (auVar12 != (undefined1  [8])psVar6) {
    operator_delete((void *)auVar12);
    psVar6 = extraout_RAX;
  }
  return (PatternList *)psVar6;
}

Assistant:

static PatternList parse_short(Tokens& tokens, std::vector<Option>& options)
{
	// shorts ::= '-' ( chars )* [ [ ' ' ] chars ] ;

	auto token = tokens.pop();

	assert(starts_with(token, "-"));
	assert(!starts_with(token, "--"));

	auto i = token.begin();
	++i; // skip the leading '-'

	PatternList ret;
	while (i != token.end()) {
		std::string shortOpt = { '-', *i };
		++i;

		std::vector<Option const*> similar;
		for(auto const& option : options) {
			if (option.shortOption()==shortOpt)
				similar.push_back(&option);
		}

		if (similar.size() > 1) {
			std::string error = shortOpt + " is specified ambiguously "
			+ std::to_string(similar.size()) + " times";
			throw Tokens::OptionError(std::move(error));
		} else if (similar.empty()) {
			options.emplace_back(shortOpt, "", 0);

			auto o = std::make_shared<Option>(options.back());
			if (tokens.isParsingArgv()) {
				o->setValue(value{true});
			}
			ret.push_back(o);
		} else {
			auto o = std::make_shared<Option>(*similar[0]);
			value val;
			if (o->argCount()) {
				if (i == token.end()) {
					// consume the next token
					auto const& ttoken = tokens.current();
					if (ttoken.empty() || ttoken=="--") {
						std::string error = shortOpt + " requires an argument";
						throw Tokens::OptionError(std::move(error));
					}
					val = tokens.pop();
				} else {
					// consume all the rest
					val = std::string{i, token.end()};
					i = token.end();
				}
			}

			if (tokens.isParsingArgv()) {
				o->setValue(val ? std::move(val) : value{true});
			}
			ret.push_back(o);
		}
	}

	return ret;
}